

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_wrapper_c(miniscript_node_t *node,miniscript_node_t *parent)

{
  if ((node->type_properties & 4) == 0) {
    return -2;
  }
  node->type_properties = node->type_properties & 0x16e0a | 0x9001;
  return 0;
}

Assistant:

static int verify_miniscript_wrapper_c(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop = node->type_properties;
    (void)parent;
    if (!(x_prop & MINISCRIPT_TYPE_K))
        return WALLY_EINVAL;

    node->type_properties &= ~MINISCRIPT_TYPE_K;
    node->type_properties |= MINISCRIPT_TYPE_B;
    node->type_properties &= MINISCRIPT_TYPE_MASK | MINISCRIPT_PROPERTY_O |
                             MINISCRIPT_PROPERTY_N | MINISCRIPT_PROPERTY_D |
                             MINISCRIPT_PROPERTY_F | MINISCRIPT_PROPERTY_E |
                             MINISCRIPT_PROPERTY_M;
    node->type_properties |= MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_S;

    return WALLY_OK;
}